

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_floating<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  __const_iterator __position;
  bool bVar1;
  char_type_conflict cVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  basic_value<toml::type_config> *v;
  error_info *v_00;
  bool bVar5;
  error_info *str_00;
  string *this;
  long lVar6;
  undefined4 uVar7;
  uint uVar8;
  undefined4 uVar9;
  string str;
  result<double,_toml::error_info> res;
  source_location src;
  region reg;
  location first;
  allocator<char> local_7f2;
  allocator<char> local_7f1;
  floating_type local_7f0;
  undefined1 local_7e8 [32];
  undefined1 local_7c8 [8];
  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
  local_7c0 [4];
  undefined **local_760;
  char *local_758;
  undefined1 local_750 [32];
  undefined1 local_730 [200];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  region local_588;
  region local_520;
  location local_4b8;
  undefined1 local_470 [48];
  location local_440;
  location local_3f8;
  source_location local_3b0;
  source_location local_338;
  region local_2c0;
  error_info local_258;
  basic_value<toml::type_config> local_200;
  error_info local_138;
  error_info local_e0;
  error_info local_88;
  
  location::location(&local_4b8,loc);
  local_7e8._0_8_ = local_7e8 + 0x10;
  local_7e8._8_8_ = 0;
  local_7e8[0x10] = '\0';
  region::region(&local_520);
  if ((ctx->toml_spec_).ext_hex_float == true) {
    local_588.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)&PTR__scanner_base_004da940;
    local_588.source_.
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi._0_1_ = 0x30;
    local_760 = &PTR__scanner_base_004da940;
    local_758 = (char *)CONCAT71(local_758._1_7_,0x78);
    sequence::sequence<toml::detail::character,toml::detail::character>
              ((sequence *)local_7c8,(character *)&local_588,(character *)&local_760);
    sequence::scan((region *)local_730,(sequence *)local_7c8,loc);
    lVar6 = CONCAT71(local_730._1_7_,local_730[0]);
    region::~region((region *)local_730);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(local_7c0);
    if (lVar6 == 0) goto LAB_0032c799;
    location::operator=(loc,&local_4b8);
    syntax::hex_floating((sequence *)local_7c8,&ctx->toml_spec_);
    sequence::scan((region *)local_730,(sequence *)local_7c8,loc);
    region::operator=(&local_520,(region *)local_730);
    region::~region((region *)local_730);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(local_7c0);
    if (local_520.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5a8,
                 "toml::parse_floating: invalid hex floating: float must be like: 0xABCp-3f",
                 (allocator<char> *)&local_588);
      syntax::floating((either *)local_7c8,&ctx->toml_spec_);
      location::location(&local_3f8,loc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5c8,"",(allocator<char> *)&local_760);
      make_syntax_error<toml::detail::either>
                ((error_info *)local_730,&local_5a8,(either *)local_7c8,&local_3f8,&local_5c8);
      err<toml::error_info>((failure<toml::error_info> *)&local_88,(error_info *)local_730);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_88);
      error_info::~error_info(&local_88);
      error_info::~error_info((error_info *)local_730);
      std::__cxx11::string::~string((string *)&local_5c8);
      location::~location(&local_3f8);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(local_7c0);
      this = &local_5a8;
      goto LAB_0032cde0;
    }
    region::as_string_abi_cxx11_((string *)local_730,&local_520);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
    std::__cxx11::string::~string((string *)local_730);
    bVar5 = true;
  }
  else {
LAB_0032c799:
    syntax::floating((either *)local_7c8,&ctx->toml_spec_);
    either::scan((region *)local_730,(either *)local_7c8,loc);
    region::operator=(&local_520,(region *)local_730);
    region::~region((region *)local_730);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(local_7c0);
    if (local_520.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e8,
                 "toml::parse_floating: invalid floating: float must be like: -3.14159_26535, 6.022e+23, inf, or nan (lowercase)."
                 ,(allocator<char> *)&local_588);
      syntax::floating((either *)local_7c8,&ctx->toml_spec_);
      location::location(&local_440,loc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_608,"",(allocator<char> *)&local_760);
      make_syntax_error<toml::detail::either>
                ((error_info *)local_730,&local_5e8,(either *)local_7c8,&local_440,&local_608);
      err<toml::error_info>((failure<toml::error_info> *)&local_e0,(error_info *)local_730);
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_e0);
      error_info::~error_info(&local_e0);
      error_info::~error_info((error_info *)local_730);
      std::__cxx11::string::~string((string *)&local_608);
      location::~location(&local_440);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector(local_7c0);
      this = &local_5e8;
      goto LAB_0032cde0;
    }
    region::as_string_abi_cxx11_((string *)local_730,&local_520);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
    std::__cxx11::string::~string((string *)local_730);
    bVar5 = false;
  }
  floating_format_info::floating_format_info((floating_format_info *)&local_760);
  if (bVar5 == false) {
    local_730[0] = (string)0x65;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_7e8._0_8_,(char *)(local_7e8._0_8_ + local_7e8._8_8_));
    if (_Var3._M_current == (char *)(local_7e8._0_8_ + local_7e8._8_8_)) {
      local_7c8[0] = true;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (local_7e8._0_8_,(char *)(local_7e8._0_8_ + local_7e8._8_8_));
      if (_Var3._M_current == (char *)(local_7e8._0_8_ + local_7e8._8_8_)) {
        local_760 = (undefined **)CONCAT71(local_760._1_7_,1);
        goto LAB_0032c8ac;
      }
    }
    local_760 = (undefined **)CONCAT71(local_760._1_7_,2);
  }
  else {
    local_760 = (undefined **)CONCAT71(local_760._1_7_,3);
  }
LAB_0032c8ac:
  local_730[0] = (string)0x5f;
  _Var3 = std::
          __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_7e8._0_8_,(char *)(local_7e8._0_8_ + local_7e8._8_8_),
                     (_Iter_equals_val<const_char>)local_730);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e8,
             (__const_iterator)_Var3._M_current,(char *)(local_7e8._0_8_ + local_7e8._8_8_));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_7e8,"inf");
  local_7f0 = INFINITY;
  if ((bVar1) ||
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_7e8,"+inf"), bVar1)) {
LAB_0032cb47:
    if (((ctx->toml_spec_).ext_num_suffix == true) && (cVar2 = location::current(loc), cVar2 == '_')
       ) {
      syntax::num_suffix((sequence *)local_730,&ctx->toml_spec_);
      sequence::scan((region *)local_7c8,(sequence *)local_730,loc);
      std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
      ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
               *)(local_730 + 8));
      lVar6 = CONCAT71(local_7c8._1_7_,local_7c8[0]);
      if (lVar6 == 0) {
        region::region(&local_588,loc);
        source_location::source_location((source_location *)local_730,&local_588);
        region::~region(&local_588);
        location::operator=(loc,&local_4b8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_628,
                   "toml::parse_floating: invalid suffix: should be `_ non-digit-graph (graph | _graph)`"
                   ,&local_7f1);
        source_location::source_location(&local_3b0,(source_location *)local_730);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"here",&local_7f2);
        make_error_info<>((error_info *)&local_588,&local_628,&local_3b0,&local_648);
        err<toml::error_info>((failure<toml::error_info> *)&local_138,(error_info *)&local_588);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_138);
        error_info::~error_info(&local_138);
        error_info::~error_info((error_info *)&local_588);
        std::__cxx11::string::~string((string *)&local_648);
        source_location::~source_location(&local_3b0);
        std::__cxx11::string::~string((string *)&local_628);
        source_location::~source_location((source_location *)local_730);
      }
      else {
        region::as_string_abi_cxx11_((string *)local_730,(region *)local_7c8);
        __position._M_current._1_7_ = local_730._1_7_;
        __position._M_current._0_1_ = local_730[0];
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730,
                   __position);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_750,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_730);
        std::__cxx11::string::~string((string *)local_730);
      }
      region::~region((region *)local_7c8);
      if (lVar6 == 0) goto LAB_0032cdd8;
    }
    floating_format_info::floating_format_info
              ((floating_format_info *)local_470,(floating_format_info *)&local_760);
    local_668.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_668.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_668.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    region::region(&local_2c0,&local_520);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)local_730,local_7f0,
               (floating_format_info *)local_470,&local_668,&local_2c0);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_200,(toml *)local_730,v);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(success_type *)&local_200);
    basic_value<toml::type_config>::~basic_value(&local_200);
    basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)local_730);
    region::~region(&local_2c0);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_668);
    std::__cxx11::string::~string((string *)(local_470 + 0x10));
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_7e8,"-inf");
    if (bVar1) {
      uVar8 = 0xfff00000;
LAB_0032c934:
      local_7f0 = (floating_type)((ulong)uVar8 << 0x20);
      goto LAB_0032cb47;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_7e8,"nan");
    local_7f0 = NAN;
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_7e8,"+nan"), bVar1)) goto LAB_0032cb47;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_7e8,"-nan");
    if (bVar1) {
      uVar8 = 0xfff80000;
      goto LAB_0032c934;
    }
    if (local_7e8._8_8_ == 0) {
      lVar6 = 0;
    }
    else {
      lVar6 = -(ulong)((*(char *)local_7e8._0_8_ - 0x2bU & 0xfd) == 0);
    }
    local_730[0] = (string)0x2e;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (local_7e8._0_8_,(char *)(local_7e8._0_8_ + local_7e8._8_8_));
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<toml::detail::parse_floating<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_1_>>
                      (local_7e8._0_8_,(char *)(local_7e8._0_8_ + local_7e8._8_8_));
    if ((floating_format)local_760 == scientific) {
      local_758 = _Var4._M_current + (lVar6 - local_7e8._0_8_);
      if (_Var3._M_current != (char *)(local_7e8._0_8_ + local_7e8._8_8_)) {
        local_758 = local_758 + -1;
      }
    }
    else if ((floating_format)local_760 == hex) {
      local_758 = (char *)0x11;
    }
    else {
      local_758 = _Var4._M_current + ~(ulong)_Var3._M_current;
    }
    region::region((region *)local_7c8,loc);
    source_location::source_location((source_location *)local_730,(region *)local_7c8);
    region::~region((region *)local_7c8);
    source_location::source_location(&local_338,(source_location *)local_730);
    str_00 = (error_info *)local_7e8;
    type_config::parse_float
              ((result<double,_toml::error_info> *)local_7c8,(string *)str_00,&local_338,bVar5);
    source_location::~source_location(&local_338);
    bVar5 = local_7c8[0];
    if (local_7c8[0] == true) {
      uVar7 = SUB84(local_7c0[0].
                    super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                    ._M_impl.super__Vector_impl_data._M_start,0);
      uVar9 = (undefined4)
              ((ulong)local_7c0[0].
                      super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 0x20);
    }
    else {
      err<toml::error_info_const&>((failure<toml::error_info> *)&local_258,(toml *)local_7c0,v_00);
      str_00 = &local_258;
      result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                (__return_storage_ptr__,(failure_type *)&local_258);
      error_info::~error_info(&local_258);
      uVar7 = 0;
      uVar9 = 0;
    }
    local_7f0 = (floating_type)CONCAT44(uVar9,uVar7);
    result<double,_toml::error_info>::cleanup
              ((result<double,_toml::error_info> *)local_7c8,(EVP_PKEY_CTX *)str_00);
    source_location::~source_location((source_location *)local_730);
    if (bVar5 != false) goto LAB_0032cb47;
  }
LAB_0032cdd8:
  this = (string *)local_750;
LAB_0032cde0:
  std::__cxx11::string::~string((string *)this);
  region::~region(&local_520);
  std::__cxx11::string::~string((string *)local_7e8);
  location::~location(&local_4b8);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_floating(location& loc, const context<TC>& ctx)
{
    using floating_type = typename basic_value<TC>::floating_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    bool is_hex = false;
    std::string str;
    region reg;
    if(spec.ext_hex_float && sequence(character('0'), character('x')).scan(loc).is_ok())
    {
        loc = first;
        is_hex = true;

        reg = syntax::hex_floating(spec).scan(loc);
        if( ! reg.is_ok())
        {
            return err(make_syntax_error("toml::parse_floating: "
                "invalid hex floating: float must be like: 0xABCp-3f",
                syntax::floating(spec), loc));
        }
        str = reg.as_string();
    }
    else
    {
        reg = syntax::floating(spec).scan(loc);
        if( ! reg.is_ok())
        {
            return err(make_syntax_error("toml::parse_floating: "
                "invalid floating: float must be like: -3.14159_26535, 6.022e+23, "
                "inf, or nan (lowercase).", syntax::floating(spec), loc));
        }
        str = reg.as_string();
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    floating_format_info fmt;

    if(is_hex)
    {
        fmt.fmt = floating_format::hex;
    }
    else
    {
        // since we already checked that the string conforms the TOML standard.
        if(std::find(str.begin(), str.end(), 'e') != str.end() ||
           std::find(str.begin(), str.end(), 'E') != str.end())
        {
            fmt.fmt = floating_format::scientific; // use exponent part
        }
        else
        {
            fmt.fmt = floating_format::fixed; // do not use exponent part
        }
    }

    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    floating_type val{0};

    if(str == "inf" || str == "+inf")
    {
        TOML11_CONSTEXPR_IF(std::numeric_limits<floating_type>::has_infinity)
        {
            val = std::numeric_limits<floating_type>::infinity();
        }
        else
        {
            return err(make_error_info("toml::parse_floating: inf value found"
                " but the current environment does not support inf. Please"
                " make sure that the floating-point implementation conforms"
                " IEEE 754/ISO 60559 international standard.",
                source_location(region(loc)),
                "floating_type: inf is not supported"));
        }
    }